

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O1

SparseAccessor * __thiscall
Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=
          (SparseAccessor *this,const_reference_value value)

{
  int *piVar1;
  int iVar2;
  csr_data *pcVar3;
  Matrix_Sparse_Row<double,_int> *pMVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  double *in_R9;
  index_type i_row;
  undefined1 local_3c [28];
  char local_20;
  
  pcVar3 = this->row_->ptr_data;
  local_3c._0_4_ =
       (undefined4)
       ((ulong)((long)(this->row_->iter_row_offset)._M_current -
               (long)(pcVar3->row_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  insert<double,int,int>
            ((pair<std::tuple<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
              *)(local_3c + 4),(Disa *)pcVar3,(CSR_Data<double,_int> *)local_3c,&this->i_column,
             (int *)value,in_R9);
  if (local_20 == '\0') {
    *(double *)local_3c._4_8_ = *value;
  }
  pMVar4 = this->row_;
  pcVar3 = pMVar4->ptr_data;
  piVar1 = (int *)((long)(pcVar3->row_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)(int)local_3c._0_4_ * 4);
  lVar7 = (long)*piVar1;
  piVar5 = (pcVar3->i_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar1[1];
  pdVar6 = (pcVar3->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pMVar4->iter_row_offset)._M_current = piVar1;
  (pMVar4->i_column)._M_ptr = piVar5 + lVar7;
  (pMVar4->i_column)._M_extent._M_extent_value = iVar2 - lVar7;
  (pMVar4->value)._M_ptr = pdVar6 + lVar7;
  (pMVar4->value)._M_extent._M_extent_value = iVar2 - lVar7;
  return this;
}

Assistant:

SparseAccessor& operator=(const_reference_value value) {
      const index_type i_row = row_.row();
      insert_or_assign(*row_.ptr_data, i_row, i_column, value);
      row_ = std::move(Matrix_Sparse_Row(row_.ptr_data, row_.ptr_data->row_offset.begin() + i_row));
      return *this;
    }